

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

int64_t get_sse(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int64_t iVar1;
  int in_ECX;
  int w;
  int h;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  uint8_t *pb;
  uint8_t *pa;
  int y;
  int x;
  int64_t total_sse;
  int dh;
  int dw;
  uint8_t *local_50;
  uint8_t *local_48;
  int local_40;
  int local_3c;
  long local_38;
  uint8_t *local_18;
  uint8_t *local_8;
  
  w = in_R8D % 0x10;
  h = in_R9D % 0x10;
  local_38 = 0;
  if (0 < w) {
    local_38 = encoder_sse(in_RDI + (in_R8D - w),in_ESI,in_RDX + (in_R8D - w),in_ECX,w,in_R9D);
  }
  if (0 < h) {
    iVar1 = encoder_sse(in_RDI + (in_R9D - h) * in_ESI,in_ESI,in_RDX + (in_R9D - h) * in_ECX,in_ECX,
                        in_R8D - w,h);
    local_38 = iVar1 + local_38;
  }
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_40 = 0; local_40 < in_R9D / 0x10; local_40 = local_40 + 1) {
    local_48 = local_8;
    local_50 = local_18;
    for (local_3c = 0; local_3c < in_R8D / 0x10; local_3c = local_3c + 1) {
      iVar1 = (*aom_sse)(local_48,in_ESI,local_50,in_ECX,0x10,0x10);
      local_38 = iVar1 + local_38;
      local_48 = local_48 + 0x10;
      local_50 = local_50 + 0x10;
    }
    local_8 = local_8 + (in_ESI << 4);
    local_18 = local_18 + (in_ECX << 4);
  }
  return local_38;
}

Assistant:

static int64_t get_sse(const uint8_t *a, int a_stride, const uint8_t *b,
                       int b_stride, int width, int height) {
  const int dw = width % 16;
  const int dh = height % 16;
  int64_t total_sse = 0;
  int x, y;

  if (dw > 0) {
    total_sse += encoder_sse(&a[width - dw], a_stride, &b[width - dw], b_stride,
                             dw, height);
  }

  if (dh > 0) {
    total_sse +=
        encoder_sse(&a[(height - dh) * a_stride], a_stride,
                    &b[(height - dh) * b_stride], b_stride, width - dw, dh);
  }

  for (y = 0; y < height / 16; ++y) {
    const uint8_t *pa = a;
    const uint8_t *pb = b;
    for (x = 0; x < width / 16; ++x) {
      total_sse += aom_sse(pa, a_stride, pb, b_stride, 16, 16);

      pa += 16;
      pb += 16;
    }

    a += 16 * a_stride;
    b += 16 * b_stride;
  }

  return total_sse;
}